

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O0

void __thiscall Json::FastWriter::FastWriter(FastWriter *this)

{
  Writer *in_RDI;
  
  Writer::Writer(in_RDI);
  in_RDI->_vptr_Writer = (_func_int **)&PTR__FastWriter_00143be0;
  std::__cxx11::string::string((string *)(in_RDI + 1));
  *(undefined1 *)&in_RDI[5]._vptr_Writer = 0;
  *(undefined1 *)((long)&in_RDI[5]._vptr_Writer + 1) = 0;
  *(undefined1 *)((long)&in_RDI[5]._vptr_Writer + 2) = 0;
  return;
}

Assistant:

FastWriter::FastWriter()
    : yamlCompatiblityEnabled_(false), dropNullPlaceholders_(false),
      omitEndingLineFeed_(false) {}